

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh.c
# Opt level: O3

void nsh_run(nsh_t *nsh)

{
  nsh_history_t *hist;
  char cVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  nsh_status_t nVar5;
  size_t sVar6;
  nsh_cmd_t *pnVar7;
  long lVar8;
  undefined1 *puVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char *argv [32];
  char args [32] [16];
  char *local_648;
  long alStack_640 [32];
  nsh_cmd_array_t local_540;
  undefined1 local_238 [520];
  
  memset(&local_648,0,0x100);
  hist = &nsh->history;
LAB_00101392:
  nsh_io_print_prompt();
  nsh->current_history_entry = 0xffffffff;
  nsh_line_buffer_reset(&nsh->line);
LAB_001013ae:
  do {
    cVar1 = nsh_io_get_char();
    switch(cVar1) {
    case '\b':
      _Var2 = nsh_line_buffer_is_empty(&nsh->line);
      if (!_Var2) {
        nsh_io_erase_last_char();
        nsh_line_buffer_erase_last_char(&nsh->line);
      }
      goto LAB_001013ae;
    case '\t':
      nsh_cmd_array_init(&local_540);
      uVar12 = (nsh->cmds).count;
      uVar10 = (ulong)uVar12;
      if (uVar12 != 0) {
        uVar13 = 0;
        pnVar7 = (nsh->cmds).array;
        do {
          iVar4 = bcmp(nsh,pnVar7->name,(ulong)(nsh->line).size);
          if (iVar4 == 0) {
            uVar10 = (ulong)local_540.count;
            local_540.count = local_540.count + 1;
            nsh_cmd_copy(local_540.array + uVar10,pnVar7);
            uVar10 = (ulong)(nsh->cmds).count;
          }
          uVar13 = uVar13 + 1;
          pnVar7 = pnVar7 + 1;
        } while (uVar13 < uVar10);
      }
      if (local_540.count != 0) {
        nsh_cmd_array_lexicographic_sort(&local_540);
        nsh_io_put_newline();
        if (local_540.count != 0) {
          pcVar11 = local_540.array[0].name;
          uVar10 = 0;
          do {
            nsh_io_put_string(pcVar11);
            nsh_io_put_char(' ');
            uVar10 = uVar10 + 1;
            pcVar11 = pcVar11 + 0x18;
          } while (uVar10 < local_540.count);
        }
      }
      nsh_io_put_newline();
      nsh_io_print_prompt();
      nsh_io_put_buffer((char *)nsh,(nsh->line).size);
      goto LAB_001013ae;
    case '\n':
    case '\r':
      nsh_line_buffer_append_null(&nsh->line);
      _Var2 = nsh_line_buffer_is_empty(&nsh->line);
      if (!_Var2) {
        nsh_history_add_entry(hist,(char *)nsh);
      }
      nsh_io_put_newline();
      sVar6 = strlen((char *)nsh);
      if ((int)sVar6 == 0) {
        uVar13 = 0;
        uVar12 = 0;
        goto LAB_0010166a;
      }
      uVar13 = 0;
      uVar10 = 0;
      uVar12 = 0;
      goto LAB_001015dd;
    case '\v':
    case '\f':
      goto switchD_001013c5_caseD_b;
    }
    if (cVar1 == '\x1b') {
      nsh_io_get_char();
      cVar1 = nsh_io_get_char();
      if (cVar1 == 'B') {
        uVar3 = nsh->current_history_entry;
        uVar12 = uVar3;
        if (uVar3 < 0x10) goto LAB_0010153c;
LAB_00101546:
        if (uVar12 == 0xffffffff) {
          nsh_io_erase_line();
          nsh_io_print_prompt();
          nsh_line_buffer_reset(&nsh->line);
          goto LAB_001013ae;
        }
      }
      else {
        if (cVar1 != 'A') goto LAB_001013ae;
        nsh->current_history_entry = nsh->current_history_entry + 1;
        uVar3 = nsh_history_entry_count(hist);
        uVar12 = nsh->current_history_entry;
        if (uVar3 <= uVar12) {
LAB_0010153c:
          nsh->current_history_entry = uVar3 - 1;
          uVar12 = uVar3 - 1;
          goto LAB_00101546;
        }
      }
      nVar5 = nsh_history_get_entry(hist,uVar12,(char *)nsh);
      if (nVar5 == NSH_STATUS_OK) {
        nsh_io_erase_line();
        nsh_io_print_prompt();
        nsh_io_put_string((char *)nsh);
        sVar6 = strlen((char *)nsh);
        (nsh->line).size = (uint)sVar6;
      }
      goto LAB_001013ae;
    }
switchD_001013c5_caseD_b:
    nsh_io_put_char(cVar1);
    nsh_line_buffer_append_char(&nsh->line,cVar1);
    _Var2 = nsh_line_buffer_is_full(&nsh->line);
  } while (!_Var2);
  nsh_io_put_newline();
  pcVar11 = "WARNING: line buffer reach its maximum capacity\r\n";
  goto LAB_00101659;
LAB_001015dd:
  do {
    if ((nsh->line).buffer[uVar10] == ' ') {
      uVar3 = (int)uVar10 - uVar12;
      if (0xf < uVar3) goto LAB_00101392;
      memcpy(local_238 + uVar13 * 0x10,(nsh->line).buffer + uVar12,(ulong)uVar3);
      local_238[(ulong)uVar3 + uVar13 * 0x10] = 0;
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
      if (0x1f < uVar12) goto LAB_00101392;
      uVar12 = (int)uVar10 + 1;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != (sVar6 & 0xffffffff));
LAB_0010166a:
  uVar3 = (int)sVar6 - uVar12;
  if (0xf < uVar3) goto LAB_00101392;
  memcpy(local_238 + uVar13 * 0x10,(nsh->line).buffer + uVar12,(ulong)uVar3);
  local_238[(ulong)uVar3 + uVar13 * 0x10] = 0;
  uVar12 = (int)uVar13 + 1;
  if (0x1f < uVar12) goto LAB_00101392;
  if (uVar12 != 0) {
    lVar8 = (ulong)uVar12 - 1;
    auVar14._8_4_ = (int)lVar8;
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar14 = auVar14 ^ _DAT_00102020;
    puVar9 = local_238;
    uVar10 = 0;
    auVar15 = _DAT_00102010;
    do {
      auVar16 = auVar15 ^ _DAT_00102020;
      if ((bool)(~(auVar14._4_4_ < auVar16._4_4_ ||
                  auVar14._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar14._4_4_) & 1)) {
        alStack_640[uVar10 - 1] = (long)puVar9;
      }
      if (auVar16._12_4_ <= auVar14._12_4_ &&
          (auVar16._8_4_ <= auVar14._8_4_ || auVar16._12_4_ != auVar14._12_4_)) {
        alStack_640[uVar10] = (long)(puVar9 + 0x10);
      }
      uVar10 = uVar10 + 2;
      lVar8 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar8 + 2;
      puVar9 = puVar9 + 0x20;
    } while (((int)uVar13 + 2U & 0x3e) != uVar10);
  }
  if ((local_648 == (char *)0x0) || (*local_648 == '\0')) goto LAB_00101392;
  pnVar7 = nsh_cmd_array_find(&nsh->cmds,local_648);
  if (pnVar7 != (nsh_cmd_t *)0x0) {
    if (pnVar7->handler == (nsh_cmd_handler_t *)0x0) goto LAB_00101392;
    nVar5 = (*pnVar7->handler)(uVar12,&local_648);
    nsh_io_printf("command \'%s\' return %d\r\n",local_648,(ulong)nVar5);
    if (nVar5 != NSH_STATUS_CMD_NOT_FOUND) {
      if (nVar5 == NSH_STATUS_QUIT) {
        return;
      }
      goto LAB_00101392;
    }
  }
  nsh_io_put_string("ERROR: command \'");
  nsh_io_put_string(local_648);
  pcVar11 = "\' not found\r\n";
LAB_00101659:
  nsh_io_put_string(pcVar11);
  goto LAB_00101392;
}

Assistant:

void nsh_run(nsh_t* nsh)
{
    // Local storage for command line after spliting
    char args[NSH_CMD_ARGS_MAX_COUNT][NSH_MAX_STRING_SIZE];

    /*
     * Array of pointers that points to the string contained by 'args'.
     *
     * In C/C++, an array decays to a pointer in most circumstances,
     * but this isn't recursive. So a T[] decays to a T*, but a T[][]
     * doesn't decay to a T**. Therefore we are forced to add an extra
     * step: char[][] -> char*[] -> char**
     */
    char* argv[NSH_CMD_ARGS_MAX_COUNT] = { NULL };

    while (true) {
        unsigned int argc = 0;

        nsh_io_print_prompt();

        // Read a command line and store it into 'nsh->line.buffer'
        nsh_status_t status = nsh_read_line(nsh);

        if (status == NSH_STATUS_OK) {
            // Split the command line into argument tokens
            if (nsh_split_command_line(nsh->line.buffer, ' ', args, &argc) != NSH_STATUS_OK) {
                // Ignore this command since there was an error
                // TODO just print a warning to the user
                continue;
            }

            // Copy the address of all tokens into 'argv'
            for (unsigned int i = 0; i < argc; i++) {
                argv[i] = args[i];
            }

            // Execute the command with 'argc' number of argument stored in 'argv'
            nsh_status_t cmd_status = nsh_execute(nsh, argc, argv);
            if (cmd_status == NSH_STATUS_CMD_NOT_FOUND) {
                nsh_io_put_string("ERROR: command '");
                nsh_io_put_string(argv[0]);
                nsh_io_put_string("' not found\r\n");
            } else if (cmd_status == NSH_STATUS_QUIT) {
                break;
            }
        }
    }
}